

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenize.cpp
# Opt level: O3

int main(int raw_argc,char **raw_argv)

{
  llama_context *plVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  undefined8 uVar5;
  pointer pcVar6;
  llama_vocab *vocab;
  long lVar7;
  char *pcVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  long **pplVar14;
  allocator<char> *paVar15;
  undefined8 *puVar16;
  ulong uVar17;
  int iVar18;
  bool bVar19;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  argv;
  string prompt;
  llama_model_params model_params;
  string arg;
  llama_context_params ctx_params;
  undefined8 auStack_548 [16];
  ulong local_4c8;
  pointer local_4c0;
  ulong local_4b8;
  llama_context *local_4b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4a8;
  ulong local_490;
  ulong local_488;
  ulong local_480;
  undefined8 local_478;
  ulong local_470;
  char *local_468;
  char *local_460;
  undefined8 local_458;
  ulong local_450;
  string local_448;
  long *local_428 [2];
  long local_418 [2];
  long *local_408 [2];
  long local_3f8 [6];
  undefined1 local_3c8;
  undefined1 local_3c0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b0;
  byte abStack_3a0 [96];
  ios_base local_340 [392];
  allocator<char> local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  bVar3 = 0;
  local_4a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_4a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (raw_argc < 1) {
    uVar13 = 0;
  }
  else {
    uVar13 = 0;
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_3c0,raw_argv[uVar13],local_1b8);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_4a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c0);
      if ((undefined1 *)local_3c0._0_8_ != local_3c0 + 0x10) {
        operator_delete((void *)local_3c0._0_8_,local_3b0._M_allocated_capacity + 1);
      }
      uVar13 = uVar13 + 1;
    } while ((uint)raw_argc != uVar13);
    uVar13 = (long)local_4a8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_4a8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5;
  }
  if (uVar13 != (uint)raw_argc) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/examples/tokenize/tokenize.cpp"
               ,0x74,"GGML_ASSERT(%s) failed","(unsigned int) argc == argv.size()");
LAB_00115db9:
    pcVar8 = "model_path";
    uVar5 = 0x133;
LAB_00115dd3:
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/examples/tokenize/tokenize.cpp"
               ,uVar5,"GGML_ASSERT(%s) failed",pcVar8);
LAB_00115de8:
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/examples/tokenize/tokenize.cpp"
               ,0x166,"GGML_ASSERT(%s) failed","!prompt_path_set && !prompt_set");
LAB_00115e09:
    uVar5 = ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/examples/tokenize/tokenize.cpp"
                       ,0x144,"GGML_ASSERT(%s) failed","stdin_set");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_448._M_dataplus._M_p != &local_448.field_2) {
      operator_delete(local_448._M_dataplus._M_p,
                      CONCAT71(local_448.field_2._M_allocated_capacity._1_7_,
                               local_448.field_2._M_local_buf[0]) + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_4a8);
    _Unwind_Resume(uVar5);
  }
  iVar11 = (int)((ulong)((long)local_4a8.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_4a8.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 5);
  if (iVar11 < 2) {
    print_usage_information
              (((local_4a8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p);
  }
  else {
    iVar18 = 1;
    iVar12 = 0;
    local_450 = 0;
    local_458 = 0;
    local_470 = 0;
    local_478 = 0;
    local_490 = 0;
    local_4b8 = 0;
    local_4c8 = 0;
    local_4b0 = (llama_context *)0x0;
    local_460 = (char *)0x0;
    local_468 = (char *)0x0;
    local_4c0 = (pointer)0x0;
    local_488 = 0;
    local_480 = 0;
    do {
      local_3c0._0_8_ = local_3c0 + 0x10;
      pcVar6 = local_4a8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[iVar18]._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_3c0,pcVar6,
                 pcVar6 + local_4a8.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[iVar18]._M_string_length);
      iVar4 = std::__cxx11::string::compare((char *)local_3c0);
      if ((iVar4 == 0) || (iVar4 = std::__cxx11::string::compare((char *)local_3c0), iVar4 == 0)) {
        print_usage_information
                  (((local_4a8.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p);
        bVar19 = false;
        iVar12 = 0;
      }
      else {
        uVar5 = std::__cxx11::string::compare((char *)local_3c0);
        if ((int)uVar5 == 0) {
          local_450 = CONCAT71((int7)((ulong)uVar5 >> 8),1);
        }
        else {
          iVar4 = std::__cxx11::string::compare((char *)local_3c0);
          if ((iVar4 == 0) || (iVar4 = std::__cxx11::string::compare((char *)local_3c0), iVar4 == 0)
             ) {
            if (((ulong)local_4b0 & 1) != 0) {
              main_cold_4();
              goto LAB_001156be;
            }
            local_4c0 = local_4a8.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[(long)iVar18 + 1]._M_dataplus._M_p
            ;
            local_4b0 = (llama_context *)CONCAT71((int7)((ulong)local_4c0 >> 8),1);
            iVar18 = iVar18 + 1;
          }
          else {
            uVar5 = std::__cxx11::string::compare((char *)local_3c0);
            if ((int)uVar5 == 0) {
              local_458 = CONCAT71((int7)((ulong)uVar5 >> 8),1);
            }
            else {
              uVar5 = std::__cxx11::string::compare((char *)local_3c0);
              if ((int)uVar5 == 0) {
                local_470 = CONCAT71((int7)((ulong)uVar5 >> 8),1);
              }
              else {
                uVar5 = std::__cxx11::string::compare((char *)local_3c0);
                if ((int)uVar5 == 0) {
                  local_478 = CONCAT71((int7)((ulong)uVar5 >> 8),1);
                }
                else {
                  iVar4 = std::__cxx11::string::compare((char *)local_3c0);
                  if ((iVar4 == 0) ||
                     (iVar4 = std::__cxx11::string::compare((char *)local_3c0), iVar4 == 0)) {
                    if ((local_4b8 & 1) != 0) {
                      main_cold_3();
LAB_001156be:
                      iVar12 = 1;
                      bVar19 = false;
                      goto LAB_0011561f;
                    }
                    local_460 = local_4a8.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[(long)iVar18 + 1].
                                _M_dataplus._M_p;
                    local_4b8 = CONCAT71((int7)((ulong)local_460 >> 8),1);
                    iVar18 = iVar18 + 1;
                  }
                  else {
                    iVar4 = std::__cxx11::string::compare((char *)local_3c0);
                    if ((iVar4 == 0) ||
                       (iVar4 = std::__cxx11::string::compare((char *)local_3c0), iVar4 == 0)) {
                      if ((local_4c8 & 1) != 0) {
                        main_cold_2();
                        goto LAB_001156be;
                      }
                      local_468 = local_4a8.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[(long)iVar18 + 1].
                                  _M_dataplus._M_p;
                      local_4c8 = CONCAT71((int7)((ulong)local_468 >> 8),1);
                      iVar18 = iVar18 + 1;
                    }
                    else {
                      uVar5 = std::__cxx11::string::compare((char *)local_3c0);
                      if ((int)uVar5 == 0) {
                        local_490 = CONCAT71((int7)((ulong)uVar5 >> 8),1);
                      }
                      else {
                        uVar5 = std::__cxx11::string::compare((char *)local_3c0);
                        if ((int)uVar5 != 0) {
                          uVar5 = std::__cxx11::string::compare((char *)local_3c0);
                          bVar19 = true;
                          if ((int)uVar5 == 0) {
                            local_488 = CONCAT71((int7)((ulong)uVar5 >> 8),1);
                            goto LAB_0011561f;
                          }
                          main_cold_1();
                          goto LAB_001156be;
                        }
                        local_480 = CONCAT71((int7)((ulong)uVar5 >> 8),1);
                      }
                    }
                  }
                }
              }
            }
          }
        }
        bVar19 = true;
      }
LAB_0011561f:
      if ((undefined1 *)local_3c0._0_8_ != local_3c0 + 0x10) {
        operator_delete((void *)local_3c0._0_8_,local_3b0._M_allocated_capacity + 1);
      }
      pcVar8 = local_460;
      uVar10 = local_490;
      uVar17 = local_4b8;
      uVar13 = local_4c8;
      if (!bVar19) goto LAB_00115d3a;
      iVar18 = iVar18 + 1;
    } while (iVar18 < iVar11);
    if ((((ulong)local_4b0 & 1) == 0) || (local_4c0 != (pointer)0x0)) {
      if (((ulong)local_4b0 & 1) == 0) {
        main_cold_5();
      }
      else if (((local_4c8 & 1) == 0) || (local_468 != (char *)0x0)) {
        if (((local_4b8 & 1) == 0) || (local_460 != (char *)0x0)) {
          bVar2 = ((byte)local_490 & 1) + ((byte)local_4b8 & 1) + ((byte)local_4c8 & 1);
          if (bVar2 < 2) {
            if (bVar2 != 0) {
              if (local_4c0 == (pointer)0x0) goto LAB_00115db9;
              if ((local_468 == (char *)0x0 && local_460 == (char *)0x0) && (local_490 & 1) == 0) {
                pcVar8 = "prompt_path || prompt_arg || stdin_set";
                uVar5 = 0x134;
                goto LAB_00115dd3;
              }
              local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
              local_448._M_string_length = 0;
              local_448.field_2._M_local_buf[0] = '\0';
              if ((local_4c8 & 1) == 0) {
                if ((local_4b8 & 1) == 0) {
                  if ((local_490 & 1) == 0) goto LAB_00115e09;
                }
                else {
                  strlen(local_460);
                  std::__cxx11::string::_M_replace((ulong)&local_448,0,(char *)0x0,(ulong)pcVar8);
                }
LAB_0011594a:
                if ((local_480 & 1) != 0) {
                  llama_log_set(llama_log_callback_null,0);
                }
                llama_backend_init();
                llama_model_default_params(local_408);
                local_3c8 = 1;
                pplVar14 = local_408;
                puVar16 = auStack_548;
                for (lVar7 = 9; lVar7 != 0; lVar7 = lVar7 + -1) {
                  *puVar16 = *pplVar14;
                  pplVar14 = pplVar14 + (ulong)bVar3 * -2 + 1;
                  puVar16 = puVar16 + (ulong)bVar3 * -2 + 1;
                }
                pcVar6 = (pointer)llama_model_load_from_file(local_4c0);
                if (pcVar6 == (pointer)0x0) {
                  fprintf(_stderr,"Error: could not load model from file \'%s\'.\n",local_4c0);
                }
                else {
                  vocab = (llama_vocab *)llama_model_get_vocab(pcVar6);
                  llama_context_default_params(local_1b8);
                  paVar15 = local_1b8;
                  puVar16 = auStack_548;
                  for (lVar7 = 0xf; lVar7 != 0; lVar7 = lVar7 + -1) {
                    *puVar16 = *(undefined8 *)paVar15;
                    paVar15 = paVar15 + ((ulong)bVar3 * -2 + 1) * 8;
                    puVar16 = puVar16 + (ulong)bVar3 * -2 + 1;
                  }
                  local_4b0 = (llama_context *)llama_init_from_model(pcVar6);
                  if (local_4b0 != (llama_context *)0x0) {
                    local_4c0 = pcVar6;
                    if ((uVar10 & 1) != 0) {
                      if (((uVar13 & 1) != 0) || ((uVar17 & 1) != 0)) goto LAB_00115de8;
                      std::__cxx11::stringstream::stringstream((stringstream *)local_3c0);
                      std::ostream::operator<<
                                ((ostream *)(local_3c0 + 0x10),
                                 *(streambuf **)(llama_vocab_sep + *(long *)(std::cin + -0x18)));
                      uVar9 = *(uint *)(std::__ostream_insert<char,std::char_traits<char>> +
                                       *(long *)(std::cin + -0x18));
                      if ((uVar9 & 5) == 0) {
                        std::__cxx11::stringbuf::str();
                        std::__cxx11::string::operator=((string *)&local_448,(string *)local_428);
                        if (local_428[0] != local_418) {
                          operator_delete(local_428[0],local_418[0] + 1);
                        }
                      }
                      else {
                        main_cold_8();
                        iVar12 = 1;
                      }
                      std::__cxx11::stringstream::~stringstream((stringstream *)local_3c0);
                      std::ios_base::~ios_base(local_340);
                      iVar11 = iVar12;
                      if ((uVar9 & 5) != 0) goto LAB_00115d15;
                    }
                    bVar3 = llama_vocab_get_add_bos(vocab);
                    uVar13 = local_450;
                    if ((local_470 & 1) == 0) {
                      string_process_escapes(&local_448);
                    }
                    common_tokenize((vector<int,_std::allocator<int>_> *)local_3c0,vocab,&local_448,
                                    (bool)(bVar3 & ((byte)local_458 ^ 1)),
                                    (bool)(((byte)local_478 ^ 1) & 1));
                    uVar5 = local_3c0._0_8_;
                    local_4c8 = local_3b0._M_allocated_capacity;
                    if ((uVar13 & 1) != 0) {
                      putchar(0x5b);
                    }
                    local_4b8 = (long)(local_3c0._8_8_ - uVar5) >> 2;
                    uVar9 = (uint)local_4b8;
                    if (0 < (int)uVar9) {
                      uVar17 = 0;
                      do {
                        if ((uVar13 & 1) == 0) {
                          printf("%6d -> \'",(ulong)*(uint *)(uVar5 + uVar17 * 4));
                          common_token_to_piece_abi_cxx11_
                                    ((string *)local_3c0,local_4b0,
                                     *(llama_token *)(uVar5 + uVar17 * 4),true);
                          printf("%s",local_3c0._0_8_);
                          if ((undefined1 *)local_3c0._0_8_ != local_3c0 + 0x10) {
                            operator_delete((void *)local_3c0._0_8_,
                                            local_3b0._M_allocated_capacity + 1);
                          }
                          puts("\'");
                        }
                        else {
                          if (uVar17 != 0) {
                            printf(", ");
                          }
                          printf("%d",(ulong)*(uint *)(uVar5 + uVar17 * 4));
                        }
                        uVar17 = uVar17 + 1;
                      } while ((uVar9 & 0x7fffffff) != uVar17);
                    }
                    if ((uVar13 & 1) != 0) {
                      puts("]");
                    }
                    plVar1 = local_4b0;
                    pcVar6 = local_4c0;
                    if ((local_488 & 1) != 0) {
                      printf("Total number of tokens: %zu\n",local_4b8);
                    }
                    llama_free(plVar1);
                    llama_model_free(pcVar6);
                    iVar11 = 0;
                    if ((pointer)uVar5 != (pointer)0x0) {
                      operator_delete((void *)uVar5,local_4c8 - uVar5);
                      iVar11 = 0;
                    }
                    goto LAB_00115d15;
                  }
                  main_cold_9();
                }
                iVar11 = 1;
              }
              else {
                std::ifstream::ifstream(local_3c0,local_468,_S_bin);
                if ((abStack_3a0[*(long *)(local_3c0._0_8_ + -0x18)] & 5) == 0) {
                  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
                  std::ostream::operator<<(local_1a8,(streambuf *)(local_3c0 + 0x10));
                  bVar19 = (abStack_3a0[*(long *)(local_3c0._0_8_ + -0x18)] & 5) == 0;
                  if (bVar19) {
                    std::__cxx11::stringbuf::str();
                  }
                  else {
                    main_cold_7();
                  }
                  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
                  std::ios_base::~ios_base(local_138);
                }
                else {
                  main_cold_6();
                  bVar19 = false;
                }
                std::ifstream::~ifstream(local_3c0);
                std::__cxx11::string::operator=((string *)&local_448,(string *)local_408);
                if (local_408[0] != local_3f8) {
                  operator_delete(local_408[0],local_3f8[0] + 1);
                }
                uVar10 = local_490;
                uVar13 = local_4c8;
                iVar11 = 1;
                if (bVar19) goto LAB_0011594a;
              }
LAB_00115d15:
              iVar12 = iVar11;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_448._M_dataplus._M_p != &local_448.field_2) {
                operator_delete(local_448._M_dataplus._M_p,
                                CONCAT71(local_448.field_2._M_allocated_capacity._1_7_,
                                         local_448.field_2._M_local_buf[0]) + 1);
              }
              goto LAB_00115d3a;
            }
            main_cold_10();
          }
          else {
            main_cold_11();
          }
        }
        else {
          main_cold_12();
        }
      }
      else {
        main_cold_13();
      }
    }
    else {
      main_cold_14();
    }
  }
  iVar12 = 1;
LAB_00115d3a:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_4a8);
  return iVar12;
}

Assistant:

int main(int raw_argc, char ** raw_argv) {
    const std::vector<std::string> argv = ingest_args(raw_argc, raw_argv);
    const int argc = argv.size();

    if (argc <= 1) {
        print_usage_information(argv[0].c_str());
        return 1;
    }

    //////
    // Read out all the command line arguments.
    //////

    // variables where to put any arguments we see.
    bool printing_ids = false;
    bool no_bos = false;
    bool no_escape = false;
    bool no_parse_special = false;
    bool disable_logging = false;
    bool show_token_count = false;
    const char * model_path = NULL;
    const char * prompt_path = NULL;
    const char * prompt_arg = NULL;

    // track which arguments were explicitly given
    // used for sanity checking down the line
    bool model_path_set = false;
    bool prompt_path_set = false;
    bool prompt_set = false;
    bool stdin_set = false;

    int iarg = 1;
    for (; iarg < argc; ++iarg) {
        std::string arg{argv[iarg]};
        if (arg == "-h" || arg == "--help") {
            print_usage_information(argv[0].c_str());
            return 0;
        }
        else if (arg == "--ids") {
            printing_ids = true;
        }
        else if (arg == "-m" || arg == "--model") {
            if (model_path_set) {
                fprintf(stderr, "Error: -m or --model specified multiple times.\n");
                return 1;
            }
            model_path = argv[++iarg].c_str();
            model_path_set = true;
        }
        else if (arg == "--no-bos") {
            no_bos = true;
        }
        else if (arg == "--no-escape") {
            no_escape = true;
        }
        else if (arg == "--no-parse-special") {
            no_parse_special = true;
        }
        else if (arg == "-p" || arg == "--prompt") {
            if (prompt_set) {
                fprintf(stderr, "Error: -p or --prompt specified multiple times.\n");
                return 1;
            }
            prompt_arg = argv[++iarg].c_str();
            prompt_set = true;
        }
        else if (arg == "-f" || arg == "--file") {
            if (prompt_path_set) {
                fprintf(stderr, "Error: -f or --file specified multiple times.\n");
                return 1;
            }
            prompt_path = argv[++iarg].c_str();
            prompt_path_set = true;
        }
        else if (arg == "--stdin") {
            stdin_set = true;
        }
        else if (arg == "--log-disable") {
            disable_logging = true;
        }
        else if (arg == "--show-count") {
            show_token_count = true;
        }
        else {
            fprintf(stderr, "Error: unknown option '%s'\n", argv[iarg].c_str());
            return 1;
        }
    }

    //////
    // Sanity check the command line arguments.
    //////

    // Check that we have the required stuff set.
    if (model_path_set && model_path == NULL) {
        fprintf(stderr, "Error: --model requires an argument.\n");
        return 1;
    }
    if (!model_path_set) {
        fprintf(stderr, "Error: must specify --model.\n");
        return 1;
    }
    if (prompt_path_set && prompt_path == NULL) {
        fprintf(stderr, "Error: --file requires an argument.\n");
        return 1;
    }
    if (prompt_set && prompt_arg == NULL) {
        fprintf(stderr, "Error: --prompt requires an argument.\n");
        return 1;
    }
    const int prompts_set = !!(prompt_path_set) + !!(prompt_set) + !!(stdin_set);
    if (prompts_set > 1) {
        fprintf(stderr, "Error: --stdin, --file and --prompt are mutually exclusive.\n");
        return 1;
    }
    // Must have some prompt.
    if (prompts_set == 0) {
        fprintf(stderr, "Error: must specify one of: --stdin, --file or --prompt.\n");
        return 1;
    }

    GGML_ASSERT(model_path);
    GGML_ASSERT(prompt_path || prompt_arg || stdin_set);

    //////
    // Figure out where will the prompt come from.
    //////

    std::string prompt;
    if (prompt_path_set) {
        bool success = false;
        prompt = read_prompt_from_file(prompt_path, success);
        if (!success) {
            return 1;
        }
    } else if (prompt_set) {
        prompt = prompt_arg;
    } else {
        GGML_ASSERT(stdin_set);
        // we read stdin *after* loading model (early exit if model cannot
        // be loaded, which can be a nicer user experience)
    }

    //////
    // Start actually doing the tokenizing stuff.
    //////

    if (disable_logging) {
        llama_log_set(llama_log_callback_null, NULL);
    }

    llama_backend_init();

    llama_model_params model_params = llama_model_default_params();
    model_params.vocab_only = true;
    llama_model * model = llama_model_load_from_file(model_path, model_params);
    if (!model) {
        fprintf(stderr, "Error: could not load model from file '%s'.\n", model_path);
        return 1;
    }

    const llama_vocab * vocab = llama_model_get_vocab(model);

    llama_context_params ctx_params = llama_context_default_params();
    llama_context * ctx = llama_init_from_model(model, ctx_params);
    if (!ctx) {
        fprintf(stderr, "Error: could not create context.\n");
        return 1;
    }

    // read entire prompt from stdin?
    if (stdin_set) {
        GGML_ASSERT(!prompt_path_set && !prompt_set);

        std::stringstream stdin_buffer;
        stdin_buffer << std::cin.rdbuf();
        if (std::cin.fail()) {
            fprintf(stderr, "Error: could not read the entire standard input.\n");
            return 1;
        }

        prompt = stdin_buffer.str();
    }

    const bool model_wants_add_bos = llama_vocab_get_add_bos(vocab);
    const bool add_bos = model_wants_add_bos && !no_bos;
    const bool parse_special = !no_parse_special;
    const bool escape = !no_escape;

    if (escape) {
        string_process_escapes(prompt);
    }

    std::vector<llama_token> tokens;
    tokens = common_tokenize(vocab, prompt, add_bos, parse_special);

    if (printing_ids) {
        printf("[");
    }

    for (int i = 0; i < (int) tokens.size(); i++) {
        if (printing_ids) {
            if (i > 0) {
                printf(", ");
            }
            printf("%d", tokens[i]);
        } else {
            bool invalid_utf8 = false;
            printf("%6d -> '", tokens[i]);
            write_utf8_cstr_to_stdout(common_token_to_piece(ctx, tokens[i]).c_str(), invalid_utf8);
            if (invalid_utf8) {
                printf("' (utf-8 decode failure)\n");
            } else {
                printf("'\n");
            }
        }
    }

    if (printing_ids) {
        printf("]\n");
    }

    if (show_token_count) {
        printf("Total number of tokens: %zu\n", tokens.size());
    }
    // silence valgrind
    llama_free(ctx);
    llama_model_free(model);

    return 0;
}